

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O3

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_> *this,ValueType *what)

{
  iterator *piVar1;
  _Elt_pointer ppBVar2;
  pair<std::_Rb_tree_iterator<const_llvm::BasicBlock_*>,_bool> pVar3;
  
  pVar3 = std::
          _Rb_tree<llvm::BasicBlock_const*,llvm::BasicBlock_const*,std::_Identity<llvm::BasicBlock_const*>,std::less<llvm::BasicBlock_const*>,std::allocator<llvm::BasicBlock_const*>>
          ::_M_insert_unique<llvm::BasicBlock_const*const&>
                    ((_Rb_tree<llvm::BasicBlock_const*,llvm::BasicBlock_const*,std::_Identity<llvm::BasicBlock_const*>,std::less<llvm::BasicBlock_const*>,std::allocator<llvm::BasicBlock_const*>>
                      *)this,what);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppBVar2 = (this->_queue).Container.c.
              super__Deque_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar2 ==
        *(_Elt_pointer *)
         ((long)&(this->_queue).Container.c.
                 super__Deque_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>>::
      _M_push_back_aux<llvm::BasicBlock_const*const&>
                ((deque<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>> *)
                 &this->_queue,what);
      return;
    }
    *ppBVar2 = *what;
    piVar1 = &(this->_queue).Container.c.
              super__Deque_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }